

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cow_guardedTests.cpp
# Opt level: O1

void __thiscall cow_guarded_cow_guarded_1_Test::TestBody(cow_guarded_cow_guarded_1_Test *this)

{
  cow_guarded<int,_std::timed_mutex> *this_00;
  pointer *__ptr_1;
  _func_int **message;
  char *pcVar1;
  char *in_R9;
  pointer *__ptr;
  bool bVar2;
  thread th3;
  thread th2;
  thread th1;
  shared_handle data_handle_1;
  handle data_handle;
  cow_guarded<int,_std::timed_mutex> data;
  AssertHelper local_108;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_f8;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_e8;
  undefined1 local_e0 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d0;
  AssertHelper local_c0;
  undefined1 local_b8 [16];
  undefined1 local_a8 [48];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_78;
  
  local_b8._0_8_ = local_b8._0_8_ & 0xffffffff00000000;
  gmlc::libguarded::cow_guarded<int,_std::timed_mutex>::cow_guarded<int>
            ((cow_guarded<int,_std::timed_mutex> *)(local_a8 + 0x18),(int *)local_b8);
  gmlc::libguarded::cow_guarded<int,_std::timed_mutex>::lock
            ((handle *)local_b8,(cow_guarded<int,_std::timed_mutex> *)(local_a8 + 0x18));
  *(int *)local_a8._16_8_ = *(int *)local_a8._16_8_ + 1;
  std::unique_ptr<int,_gmlc::libguarded::cow_guarded<int,_std::timed_mutex>::deleter>::~unique_ptr
            ((unique_ptr<int,_gmlc::libguarded::cow_guarded<int,_std::timed_mutex>::deleter> *)
             local_b8);
  this_00 = (cow_guarded<int,_std::timed_mutex> *)(local_a8 + 0x18);
  gmlc::libguarded::cow_guarded<int,_std::timed_mutex>::lock_shared(this_00);
  bVar2 = CONCAT71(local_e0._1_7_,local_e0[0]) != 0;
  local_f0._M_head_impl._0_1_ = bVar2;
  local_e8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!bVar2) {
    testing::Message::Message((Message *)&local_100);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_b8,(internal *)&local_f0,(AssertionResult *)"data_handle != nullptr",
               "false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_108,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/GMLC-TDC[P]concurrency/tests/libguarded/cow_guardedTests.cpp"
               ,0x29,(char *)local_b8._0_8_);
    testing::internal::AssertHelper::operator=(&local_108,(Message *)&local_100);
    testing::internal::AssertHelper::~AssertHelper(&local_108);
    if ((mutex_type *)local_b8._0_8_ != (mutex_type *)local_a8) {
      operator_delete((void *)local_b8._0_8_,(ulong)(local_a8._0_8_ + 1));
    }
    if (local_100._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_100._M_head_impl + 8))();
    }
  }
  if (local_e8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_e8,local_e8);
  }
  local_f0._M_head_impl._0_4_ = 1;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_b8,"*data_handle","1",(int *)CONCAT71(local_e0._1_7_,local_e0[0]),
             (int *)&local_f0);
  if (local_b8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_f0);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b8._8_8_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((_Alloc_hider *)local_b8._8_8_)->_M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_100,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/GMLC-TDC[P]concurrency/tests/libguarded/cow_guardedTests.cpp"
               ,0x2a,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_100,(Message *)&local_f0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_100);
    if (local_f0._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_f0._M_head_impl + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b8._8_8_ !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(local_b8 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b8._8_8_
                );
  }
  local_f0._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_b8._0_8_ = operator_new(0x10);
  (((mutex_type *)local_b8._0_8_)->super___mutex_base)._M_mutex.__align =
       (long)&PTR___State_00174910;
  *(cow_guarded<int,_std::timed_mutex> **)
   ((long)&(((mutex_type *)local_b8._0_8_)->super___mutex_base)._M_mutex + 8) = this_00;
  std::thread::_M_start_thread(&local_f0,local_b8,0);
  if ((mutex_type *)local_b8._0_8_ != (mutex_type *)0x0) {
    (**(code **)(*(long *)local_b8._0_8_ + 8))();
  }
  local_100._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_b8._0_8_ = operator_new(0x10);
  (((mutex_type *)local_b8._0_8_)->super___mutex_base)._M_mutex.__align =
       (long)&PTR___State_00174950;
  *(cow_guarded<int,_std::timed_mutex> **)
   ((long)&(((mutex_type *)local_b8._0_8_)->super___mutex_base)._M_mutex + 8) = this_00;
  std::thread::_M_start_thread(&local_100,local_b8,0);
  if ((mutex_type *)local_b8._0_8_ != (mutex_type *)0x0) {
    (**(code **)(*(long *)local_b8._0_8_ + 8))();
  }
  local_108.data_ = (AssertHelperData *)0x0;
  local_b8._0_8_ = operator_new(0x10);
  (((mutex_type *)local_b8._0_8_)->super___mutex_base)._M_mutex.__align =
       (long)&PTR___State_00174990;
  *(cow_guarded<int,_std::timed_mutex> **)
   ((long)&(((mutex_type *)local_b8._0_8_)->super___mutex_base)._M_mutex + 8) = this_00;
  std::thread::_M_start_thread(&local_108,local_b8,0);
  if ((mutex_type *)local_b8._0_8_ != (mutex_type *)0x0) {
    (**(code **)(*(long *)local_b8._0_8_ + 8))();
  }
  std::thread::join();
  std::thread::join();
  std::thread::join();
  if (((local_108.data_ == (AssertHelperData *)0x0) &&
      (local_100._M_head_impl ==
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) &&
     (local_f0._M_head_impl ==
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
    if (local_d8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8);
    }
    gmlc::libguarded::cow_guarded<int,_std::timed_mutex>::lock
              ((handle *)local_b8,(cow_guarded<int,_std::timed_mutex> *)(local_a8 + 0x18));
    gmlc::libguarded::cow_guarded<int,_std::timed_mutex>::lock_shared
              ((cow_guarded<int,_std::timed_mutex> *)(local_a8 + 0x18));
    *(int *)local_a8._16_8_ = *(int *)local_a8._16_8_ + 1;
    local_100._M_head_impl._0_4_ = 2;
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)local_e0,"*data_handle","2",(int *)local_a8._16_8_,(int *)&local_100);
    if (local_e0[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_100);
      if (local_d8 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        message = (_func_int **)0x15a70a;
      }
      else {
        message = (_func_int **)(local_d8->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_108,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/GMLC-TDC[P]concurrency/tests/libguarded/cow_guardedTests.cpp"
                 ,0x4d,(char *)message);
      testing::internal::AssertHelper::operator=(&local_108,(Message *)&local_100);
      testing::internal::AssertHelper::~AssertHelper(&local_108);
      if (local_100._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_100._M_head_impl + 8))();
      }
    }
    if (local_d8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_d8,local_d8);
    }
    local_100._M_head_impl._0_1_ =
         local_f0._M_head_impl !=
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    local_f8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (local_f0._M_head_impl ==
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      testing::Message::Message((Message *)&local_108);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_e0,(internal *)&local_100,
                 (AssertionResult *)"data_handle2 != nullptr","false","true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_c0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/GMLC-TDC[P]concurrency/tests/libguarded/cow_guardedTests.cpp"
                 ,0x4f,(char *)CONCAT71(local_e0._1_7_,local_e0[0]));
      testing::internal::AssertHelper::operator=(&local_c0,(Message *)&local_108);
      testing::internal::AssertHelper::~AssertHelper(&local_c0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT71(local_e0._1_7_,local_e0[0]) != &local_d0) {
        operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)CONCAT71(local_e0._1_7_,local_e0[0]),local_d0._M_allocated_capacity + 1);
      }
      if (local_108.data_ != (AssertHelperData *)0x0) {
        (**(code **)(*(long *)local_108.data_ + 8))();
      }
    }
    if (local_f8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_f8,local_f8);
    }
    local_100._M_head_impl._0_4_ = 1;
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)local_e0,"*data_handle2","1",(int *)local_f0._M_head_impl,
               (int *)&local_100);
    if (local_e0[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_100);
      if (local_d8 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar1 = "";
      }
      else {
        pcVar1 = (local_d8->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_108,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/GMLC-TDC[P]concurrency/tests/libguarded/cow_guardedTests.cpp"
                 ,0x50,pcVar1);
      testing::internal::AssertHelper::operator=(&local_108,(Message *)&local_100);
      testing::internal::AssertHelper::~AssertHelper(&local_108);
      if (local_100._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_100._M_head_impl + 8))();
      }
    }
    if (local_d8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_d8,local_d8);
    }
    gmlc::libguarded::cow_guarded<int,_std::timed_mutex>::handle::cancel((handle *)local_b8);
    local_100._M_head_impl._0_1_ = (int *)local_a8._16_8_ == (int *)0x0;
    local_f8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if ((int *)local_a8._16_8_ != (int *)0x0) {
      testing::Message::Message((Message *)&local_108);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_e0,(internal *)&local_100,
                 (AssertionResult *)"data_handle == nullptr","false","true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_c0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/GMLC-TDC[P]concurrency/tests/libguarded/cow_guardedTests.cpp"
                 ,0x53,(char *)CONCAT71(local_e0._1_7_,local_e0[0]));
      testing::internal::AssertHelper::operator=(&local_c0,(Message *)&local_108);
      testing::internal::AssertHelper::~AssertHelper(&local_c0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT71(local_e0._1_7_,local_e0[0]) != &local_d0) {
        operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)CONCAT71(local_e0._1_7_,local_e0[0]),local_d0._M_allocated_capacity + 1);
      }
      if (local_108.data_ != (AssertHelperData *)0x0) {
        (**(code **)(*(long *)local_108.data_ + 8))();
      }
    }
    if (local_f8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_f8,local_f8);
    }
    local_100._M_head_impl._0_1_ =
         local_f0._M_head_impl !=
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    local_f8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (local_f0._M_head_impl ==
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      testing::Message::Message((Message *)&local_108);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_e0,(internal *)&local_100,
                 (AssertionResult *)"data_handle2 != nullptr","false","true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_c0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/GMLC-TDC[P]concurrency/tests/libguarded/cow_guardedTests.cpp"
                 ,0x55,(char *)CONCAT71(local_e0._1_7_,local_e0[0]));
      testing::internal::AssertHelper::operator=(&local_c0,(Message *)&local_108);
      testing::internal::AssertHelper::~AssertHelper(&local_c0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT71(local_e0._1_7_,local_e0[0]) != &local_d0) {
        operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)CONCAT71(local_e0._1_7_,local_e0[0]),local_d0._M_allocated_capacity + 1);
      }
      if (local_108.data_ != (AssertHelperData *)0x0) {
        (**(code **)(*(long *)local_108.data_ + 8))();
      }
    }
    if (local_f8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_f8,local_f8);
    }
    local_100._M_head_impl._0_4_ = 1;
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)local_e0,"*data_handle2","1",(int *)local_f0._M_head_impl,
               (int *)&local_100);
    if (local_e0[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_100);
      if (local_d8 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar1 = "";
      }
      else {
        pcVar1 = (local_d8->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_108,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/GMLC-TDC[P]concurrency/tests/libguarded/cow_guardedTests.cpp"
                 ,0x56,pcVar1);
      testing::internal::AssertHelper::operator=(&local_108,(Message *)&local_100);
      testing::internal::AssertHelper::~AssertHelper(&local_108);
      if (local_100._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_100._M_head_impl + 8))();
      }
    }
    if (local_d8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_d8,local_d8);
    }
    if (local_e8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e8);
    }
    std::unique_ptr<int,_gmlc::libguarded::cow_guarded<int,_std::timed_mutex>::deleter>::~unique_ptr
              ((unique_ptr<int,_gmlc::libguarded::cow_guarded<int,_std::timed_mutex>::deleter> *)
               local_b8);
    gmlc::libguarded::cow_guarded<int,_std::timed_mutex>::lock_shared
              ((cow_guarded<int,_std::timed_mutex> *)(local_a8 + 0x18));
    bVar2 = CONCAT71(local_e0._1_7_,local_e0[0]) != 0;
    local_f0._M_head_impl._0_1_ = bVar2;
    local_e8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (!bVar2) {
      testing::Message::Message((Message *)&local_100);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_b8,(internal *)&local_f0,
                 (AssertionResult *)"data_handle != nullptr","false","true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_108,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/GMLC-TDC[P]concurrency/tests/libguarded/cow_guardedTests.cpp"
                 ,0x5c,(char *)local_b8._0_8_);
      testing::internal::AssertHelper::operator=(&local_108,(Message *)&local_100);
      testing::internal::AssertHelper::~AssertHelper(&local_108);
      if ((mutex_type *)local_b8._0_8_ != (mutex_type *)local_a8) {
        operator_delete((void *)local_b8._0_8_,(ulong)(local_a8._0_8_ + 1));
      }
      if (local_100._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_100._M_head_impl + 8))();
      }
    }
    if (local_e8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_e8,local_e8);
    }
    local_f0._M_head_impl._0_4_ = 1;
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)local_b8,"*data_handle","1",(int *)CONCAT71(local_e0._1_7_,local_e0[0]),
               (int *)&local_f0);
    if (local_b8[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_f0);
      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b8._8_8_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar1 = "";
      }
      else {
        pcVar1 = ((_Alloc_hider *)local_b8._8_8_)->_M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_100,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/GMLC-TDC[P]concurrency/tests/libguarded/cow_guardedTests.cpp"
                 ,0x5d,pcVar1);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_100,(Message *)&local_f0);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_100);
      if (local_f0._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_f0._M_head_impl + 8))();
      }
    }
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b8._8_8_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)(local_b8 + 8),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   local_b8._8_8_);
    }
    if (local_d8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8);
    }
    if (local_78 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_78);
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a8._32_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a8._32_8_);
    }
    return;
  }
  std::terminate();
}

Assistant:

TEST(cow_guarded, cow_guarded_1)
{
    cow_guarded<int, std::timed_mutex> data(0);

    {
        auto data_handle = data.lock();

        ++(*data_handle);
    }

    {
        auto data_handle = data.lock_shared();

        EXPECT_TRUE(data_handle != nullptr);
        EXPECT_EQ(*data_handle, 1);

        std::thread th1([&data]() {
            auto data_handle2 = data.try_lock_shared();
            EXPECT_TRUE(data_handle2 != nullptr);
            EXPECT_EQ(*data_handle2, 1);
        });

        std::thread th2([&data]() {
            auto data_handle2 =
                data.try_lock_shared_for(std::chrono::milliseconds(20));
            EXPECT_TRUE(data_handle2 != nullptr);
            EXPECT_EQ(*data_handle2, 1);
        });

        std::thread th3([&data]() {
            auto data_handle2 =
                data.try_lock_shared_until(std::chrono::steady_clock::now() +
                                           std::chrono::milliseconds(20));
            EXPECT_TRUE(data_handle2 != nullptr);
            EXPECT_EQ(*data_handle2, 1);
        });

        th1.join();

        th2.join();
        th3.join();
    }

    {
        auto data_handle = data.lock();

        auto data_handle2 = data.lock_shared();

        ++(*data_handle);
        EXPECT_EQ(*data_handle, 2);

        EXPECT_TRUE(data_handle2 != nullptr);
        EXPECT_EQ(*data_handle2, 1);

        data_handle.cancel();
        EXPECT_TRUE(data_handle == nullptr);

        EXPECT_TRUE(data_handle2 != nullptr);
        EXPECT_EQ(*data_handle2, 1);
    }

    {
        auto data_handle = data.lock_shared();

        EXPECT_TRUE(data_handle != nullptr);
        EXPECT_EQ(*data_handle, 1);
    }
}